

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

void Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::
     parseLoopAttributes(char *content,SizeT end_offset,LoopTag *tag)

{
  char cVar1;
  SizeT SVar2;
  LoopTag *pLVar3;
  SizeT SVar4;
  byte bVar5;
  SizeT offset;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar11;
  SizeT SVar13;
  LoopTag *pLVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 uVar17;
  SizeT SVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  byte local_49;
  int iVar10;
  ulong uVar12;
  
  SVar2 = tag->Offset;
  pLVar3 = tag->Parent;
  local_49 = tag->Options;
  uVar15 = (ulong)end_offset;
  uVar17 = 0;
  uVar11 = SVar2 + 5;
LAB_00123fbe:
  uVar16 = (ulong)uVar11;
  iVar6 = end_offset - uVar11;
  if (end_offset < uVar11 || iVar6 == 0) goto LAB_001240fa;
  lVar19 = 0;
  do {
    cVar1 = content[lVar19 + uVar16];
    if (cVar1 != ' ') {
      iVar10 = (int)lVar19;
      if (cVar1 == 'g') {
        if ((uint)(iVar6 - iVar10) < 6) goto LAB_001240f5;
        lVar8 = 0;
        goto LAB_00124039;
      }
      if (cVar1 == 's') {
        if ((uint)(iVar6 - iVar10) < 4) goto LAB_001240f5;
        lVar8 = 0;
        goto LAB_0012406c;
      }
      if (cVar1 != 'v') {
        uVar11 = uVar11 + 1 + iVar10;
        goto LAB_00124247;
      }
      if ((uint)(iVar6 - iVar10) < 6) goto LAB_001240f5;
      lVar8 = 0;
      goto LAB_0012400c;
    }
    lVar19 = lVar19 + 1;
    uVar12 = uVar15;
  } while (iVar6 != (int)lVar19);
  goto LAB_00124111;
  while (lVar8 = lVar8 + 1, lVar8 != 5) {
LAB_00124039:
    if (content[lVar8 + lVar19 + uVar16] != "group"[lVar8]) {
      if (lVar8 != 5) goto LAB_001240f5;
      break;
    }
  }
  uVar16 = (ulong)(uVar11 + 5 + iVar10);
  uVar17 = 4;
  goto LAB_001240fa;
  while (lVar8 = lVar8 + 1, lVar8 != 3) {
LAB_0012406c:
    if (content[lVar8 + lVar19 + uVar16] != "set"[lVar8]) {
      if (lVar8 != 3) {
        if (iVar6 + -4 == iVar10) goto LAB_001240f5;
        lVar8 = 0;
        goto LAB_001240c9;
      }
      break;
    }
  }
  uVar16 = (ulong)(uVar11 + 3 + iVar10);
  uVar17 = 1;
  goto LAB_001240fa;
  while (lVar8 = lVar8 + 1, lVar8 != 4) {
LAB_001240c9:
    if (content[lVar8 + lVar19 + uVar16] != "sort"[lVar8]) {
      if (lVar8 != 4) goto LAB_001240f5;
      break;
    }
  }
  uVar16 = (ulong)(uVar11 + 4 + iVar10);
  uVar17 = 3;
  goto LAB_001240fa;
  while (lVar8 = lVar8 + 1, lVar8 != 5) {
LAB_0012400c:
    if (content[lVar8 + lVar19 + uVar16] != "value"[lVar8]) {
      if (lVar8 != 5) goto LAB_001240f5;
      break;
    }
  }
  uVar16 = (ulong)(uVar11 + 5 + iVar10);
  uVar17 = 2;
LAB_001240fa:
  uVar12 = uVar16;
  if ((uint)uVar16 < end_offset) {
    do {
      uVar12 = uVar16;
      if (content[uVar16] == '=') break;
      uVar16 = uVar16 + 1;
      uVar12 = uVar15;
    } while (uVar15 != uVar16);
  }
LAB_00124111:
  iVar6 = (int)uVar12;
  uVar20 = iVar6 + 1;
  uVar7 = (uint)(byte)(1 - (char)SVar2) + iVar6;
  iVar6 = (iVar6 + 2U & 0xff) - 1;
  uVar11 = uVar20;
  do {
    uVar21 = uVar11;
    iVar10 = (int)uVar12;
    uVar9 = iVar10 + 1;
    uVar12 = (ulong)uVar9;
    if (end_offset <= uVar9) {
      return;
    }
    uVar20 = uVar20 + 1;
    bVar5 = (char)uVar7 + 1;
    uVar7 = (uint)bVar5;
    iVar6 = iVar6 + 1;
    uVar11 = uVar21 + 1;
  } while (content[uVar9] == ' ');
  uVar16 = (ulong)uVar21;
  uVar11 = iVar10 + 2;
  SVar4 = uVar21;
  do {
    uVar16 = uVar16 + 1;
    SVar18 = end_offset - 1;
    SVar13 = end_offset;
    if (uVar15 <= uVar16) break;
    SVar13 = SVar4 + 1;
    SVar18 = SVar4;
    SVar4 = SVar13;
  } while (content[uVar16] != content[uVar9]);
  switch(uVar17) {
  case 1:
    (tag->Set).Offset = uVar11;
    (tag->Set).Length = (short)SVar13 - (short)uVar20;
    if (pLVar3 != (LoopTag *)0x0) {
      pLVar14 = pLVar3;
      do {
        bVar5 = pLVar14->ValueLength;
        if (bVar5 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          while (content[uVar16 + (uVar21 + 1)] ==
                 content[uVar16 + ((uint)pLVar14->ValueOffset + pLVar14->Offset)]) {
            uVar16 = uVar16 + 1;
            if (bVar5 == uVar16) goto LAB_00124255;
          }
        }
        if ((uint)uVar16 == (uint)bVar5) {
LAB_00124255:
          (tag->Set).IDLength = bVar5;
          (tag->Set).Level = pLVar14->Level;
          break;
        }
        pLVar14 = pLVar14->Parent;
      } while (pLVar14 != (LoopTag *)0x0);
    }
    break;
  case 2:
    tag->ValueOffset = bVar5;
    tag->ValueLength = (char)SVar13 - (char)iVar6;
    break;
  case 3:
    local_49 = local_49 | (content[uVar11] != 'a') * '\x02' + 2U;
    tag->Options = local_49;
    break;
  case 4:
    tag->GroupOffset = bVar5;
    tag->GroupLength = (char)SVar13 - (char)iVar6;
  }
  uVar11 = SVar18 + 2;
LAB_00124247:
  if (end_offset <= uVar11) {
    return;
  }
  goto LAB_00123fbe;
LAB_001240f5:
  uVar16 = (ulong)(uVar11 + 1 + iVar10);
  goto LAB_001240fa;
}

Assistant:

inline static void parseLoopAttributes(const Char_T *content, const SizeT end_offset, LoopTag &tag) noexcept {
        enum struct LoopAttributes : SizeT8 { None = 0, Set, Value, Sort, Group };
        SizeT offset = (tag.Offset + TagPatterns::LoopPrefixLength);

        LoopAttributes att_type = LoopAttributes::None;

        do {
            while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar)) {
                ++offset;
            }

            if (offset < end_offset) {
                switch (content[offset]) {
                    case TagPatterns::SetSortChar: {
                        const SizeT tmp_length = (end_offset - offset);

                        if ((tmp_length > TagPatterns::SetLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Set, TagPatterns::SetLength)) {
                            offset += TagPatterns::SetLength;
                            att_type = LoopAttributes::Set;
                            break;
                        }

                        if ((tmp_length > TagPatterns::SortLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Sort, TagPatterns::SortLength)) {
                            offset += TagPatterns::SortLength;
                            att_type = LoopAttributes::Sort;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::ValueChar: {
                        if (((end_offset - offset) > TagPatterns::ValueLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Value, TagPatterns::ValueLength)) {
                            offset += TagPatterns::ValueLength;
                            att_type = LoopAttributes::Value;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::GroupChar: {
                        if (((end_offset - offset) > TagPatterns::GroupLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Group, TagPatterns::GroupLength)) {
                            offset += TagPatterns::GroupLength;
                            att_type = LoopAttributes::Group;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    default: {
                        ++offset;
                        continue;
                    }
                }
            }

            while ((offset < end_offset) && (content[offset] != TagPatterns::EqualChar)) {
                ++offset;
            }

            do {
                ++offset;
            } while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar));

            if (offset < end_offset) {
                const SizeT  att_offset = (offset + SizeT{1});
                const Char_T quote_char = content[offset];

                do {
                    ++offset;
                } while ((offset < end_offset) && (content[offset] != quote_char));

                switch (att_type) {
                    case LoopAttributes::Set: {
                        tag.Set.Offset = att_offset;
                        tag.Set.Length = SizeT16(offset - att_offset);
                        checkLoopVariable(content, tag.Set, tag.Parent);
                        break;
                    }

                    case LoopAttributes::Value: {
                        tag.ValueOffset = SizeT8(att_offset - tag.Offset);
                        tag.ValueLength = SizeT8(offset - att_offset);
                        break;
                    }

                    case LoopAttributes::Sort: {
                        tag.Options |=
                            ((content[att_offset] == 'a') ? LoopTagOptions::SortAscend : LoopTagOptions::SortDescend);
                        break;
                    }

                    case LoopAttributes::Group: {
                        tag.GroupOffset = SizeT8(att_offset - tag.Offset);
                        tag.GroupLength = SizeT8(offset - att_offset);
                        break;
                    }

                    default: {
                    }
                }

                ++offset;
            }
        } while (offset < end_offset);
    }